

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::dodamage(clientinfo *target,clientinfo *actor,int damage,int gun,vec *hitpush)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  teaminfo *ptVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  piVar1 = &(actor->state).guninfo[gun].damage;
  *piVar1 = *piVar1 + damage;
  if ((((enable_passflag != 0) && (gamemode + 3U < 0x1a && actor != target)) &&
      ((0x55fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0)) &&
     (iVar3 = strcmp(actor->team,target->team), iVar3 == 0)) {
    ctfservmode::dopassflagsequence((ctfservmode *)&ctfmode,actor,target);
    return;
  }
  if (nodamage == 0) {
    iVar4 = ((target->state).super_fpsstate.armourtype + 1) * damage;
    iVar3 = iVar4 + 3;
    if (-1 < iVar4) {
      iVar3 = iVar4;
    }
    iVar4 = (target->state).super_fpsstate.armour;
    iVar14 = iVar3 >> 2;
    if (iVar4 <= iVar3 >> 2) {
      iVar14 = iVar4;
    }
    (target->state).super_fpsstate.armour = iVar4 - iVar14;
    uVar13 = (iVar14 - damage) + (target->state).super_fpsstate.health;
    (target->state).super_fpsstate.health = uVar13;
    sendf(-1,1,"ri6",0xc,(ulong)(uint)target->clientnum,(ulong)(uint)actor->clientnum,
          (ulong)(uint)damage,(ulong)(uint)(iVar4 - iVar14),(ulong)uVar13);
  }
  if ((target != actor) &&
     (((0x19 < gamemode + 3U || ((0x55fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0)) ||
      (iVar3 = strcmp(target->team,actor->team), iVar3 != 0)))) {
    piVar1 = &(actor->state).damage;
    *piVar1 = *piVar1 + damage;
  }
  if (target == actor) {
LAB_0013d292:
    clientinfo::setpushed(target);
  }
  else {
    fVar19 = (hitpush->field_0).field_0.x;
    fVar18 = (hitpush->field_0).field_0.y;
    fVar20 = (hitpush->field_0).field_0.z;
    if (((fVar19 != 0.0) || (fVar18 != 0.0)) ||
       ((NAN(fVar18) || ((fVar20 != 0.0 || (NAN(fVar20))))))) {
      fVar22 = SQRT(fVar20 * fVar20 + fVar19 * fVar19 + fVar18 * fVar18);
      fVar21 = 100.0 / fVar22;
      if (1e-06 < fVar22) {
        fVar19 = fVar19 * fVar21;
        fVar18 = fVar18 * fVar21;
      }
      if ((target->state).super_fpsstate.health < 1) {
        iVar3 = -1;
      }
      else {
        iVar3 = target->ownernum;
      }
      sendf(iVar3,1,"ri7",0xd,(ulong)(uint)target->clientnum,(ulong)(uint)gun,(ulong)(uint)damage,
            (ulong)(uint)(int)fVar19,(ulong)(uint)(int)fVar18,
            (ulong)(uint)(int)(float)(~-(uint)(1e-06 < fVar22) & (uint)fVar20 |
                                     (uint)(fVar20 * fVar21) & -(uint)(1e-06 < fVar22)));
      goto LAB_0013d292;
    }
  }
  if (0 < (target->state).super_fpsstate.health) {
    return;
  }
  fVar19 = (target->state).o.field_0.field_0.x - (actor->state).o.field_0.field_0.x;
  fVar18 = (target->state).o.field_0.field_0.y - (actor->state).o.field_0.field_0.y;
  fVar20 = (target->state).o.field_0.field_0.z - (actor->state).o.field_0.field_0.z;
  fVar19 = SQRT(fVar20 * fVar20 + fVar19 * fVar19 + fVar18 * fVar18);
  if ((((target != actor) && (700.0 < fVar19)) && (0 < (int)(fVar19 + 0.5))) &&
     ((actor->state).super_fpsstate.aitype == 0)) {
    pcVar6 = colorname(actor);
    pcVar7 = colorname(target);
    out(3,"\f0%s \f7got a longshot kill on \f6%s \f7(Distance: %d\f7 feet) with a \f1%s",pcVar6,
        pcVar7,(ulong)(uint)(int)(fVar19 + 0.5),guns[gun].name);
  }
  if (((target != actor) && (fVar19 <= 20.0)) && ((actor->state).super_fpsstate.aitype == 0)) {
    pcVar8 = colorname(actor);
    pcVar9 = colorname(target);
    pcVar6 = guns[gun].name;
    iVar3 = strcmp(pcVar6,"fist");
    pcVar7 = "chainsaw";
    if (iVar3 != 0) {
      pcVar7 = pcVar6;
    }
    out(3,"\f0%s \f7got an up close kill on \f6%s \f7with a \f1%s",pcVar8,pcVar9,pcVar7);
  }
  piVar1 = &(target->state).deaths;
  *piVar1 = *piVar1 + 1;
  iVar3 = gamemode;
  if (smode == (long *)0x0) {
    if ((target == actor) ||
       (((uVar16 = (ulong)(gamemode + 3U), gamemode + 3U < 0x1a &&
         ((0x55fUL >> (uVar16 & 0x3f) & 1) == 0)) &&
        (iVar4 = strcmp(target->team,actor->team), iVar4 == 0)))) {
      piVar1 = &(actor->state).frags;
      *piVar1 = *piVar1 + -1;
      iVar4 = -1;
      goto LAB_0013d5b8;
    }
    piVar1 = &(actor->state).frags;
    *piVar1 = *piVar1 + 1;
    iVar4 = 1;
  }
  else {
    iVar4 = (**(code **)(*smode + 0x38))(smode,target,actor);
    piVar1 = &(actor->state).frags;
    *piVar1 = *piVar1 + iVar4;
    iVar3 = gamemode;
    if (iVar4 < 1) goto LAB_0013d5b8;
    uVar16 = (ulong)(gamemode + 3);
  }
  lVar11 = clients;
  if (((uint)uVar16 < 0x1a) && ((0x55fUL >> (uVar16 & 0x3f) & 1) == 0)) {
    lVar17 = (long)DAT_00193844;
    if (lVar17 < 1) {
      iVar12 = 0;
      iVar14 = 0;
    }
    else {
      lVar15 = 0;
      iVar14 = 0;
      iVar12 = 0;
      do {
        iVar5 = strcmp((char *)(*(long *)(lVar11 + lVar15 * 8) + 0x124),actor->team);
        iVar12 = iVar12 + (uint)(iVar5 == 0);
        iVar14 = iVar14 + (uint)(iVar5 != 0);
        lVar15 = lVar15 + 1;
      } while (lVar17 != lVar15);
    }
  }
  else {
    iVar14 = DAT_00193844 + -1;
    iVar12 = 1;
  }
  iVar5 = 1;
  if (iVar14 < 2) {
    iVar14 = 1;
  }
  (actor->state).effectiveness =
       (float)(iVar12 * iVar4) / (float)iVar14 + (actor->state).effectiveness;
  lVar11 = (long)totalmillis;
  if (lVar11 - (actor->state).lastfragmillis < (long)multifragmillis) {
    iVar5 = (actor->state).multifrags + 1;
  }
  (actor->state).multifrags = iVar5;
  (actor->state).lastfragmillis = lVar11;
LAB_0013d5b8:
  uVar16 = 0;
  if (((iVar3 + 3U < 0x1a) && ((0x55fUL >> ((ulong)(iVar3 + 3U) & 0x3f) & 1) == 0)) &&
     (ptVar10 = hashset<teaminfo>::access<char[260]>((hashset<teaminfo> *)&teaminfos,&actor->team),
     ptVar10 != (teaminfo *)0x0)) {
    uVar13 = iVar4 + ptVar10->frags;
    ptVar10->frags = uVar13;
    uVar16 = (ulong)uVar13;
  }
  sendf(-1,1,"ri5",0xb,(ulong)(uint)target->clientnum,(ulong)(uint)actor->clientnum,
        (ulong)(uint)(actor->state).frags,uVar16);
  if (target != actor && firstblood == '\0') {
    firstblood = '\x01';
    pcVar6 = colorname(actor);
    out(3,"\f0%s \f7drew \f6FIRST BLOOD!",pcVar6);
  }
  if ((target != actor) && ((actor->state).super_fpsstate.aitype == 0)) {
    piVar1 = &(actor->state).spreefrags;
    *piVar1 = *piVar1 + 1;
  }
  if ((minspreefrags <= (target->state).spreefrags) && ((target->state).super_fpsstate.aitype == 0))
  {
    pcVar6 = colorname(target);
    uVar2 = spreefinmsg;
    if (target == actor) {
      out(3,"\f0%s \f7%s",pcVar6,spreesuicidemsg);
    }
    else {
      pcVar7 = colorname(actor);
      out(3,"\f0%s\'s \f7%s \f6%s",pcVar6,uVar2,pcVar7);
    }
  }
  (target->state).lastfragmillis = 0;
  (target->state).multifrags = 0;
  (target->state).spreefrags = 0;
  if (0 < DAT_001942d4) {
    lVar17 = 0x108;
    lVar15 = 0;
    lVar11 = spreemessages;
    iVar3 = DAT_001942d4;
    do {
      if ((actor->state).spreefrags == *(int *)(lVar11 + -0x108 + lVar17)) {
        pcVar6 = colorname(actor);
        out(3,"\f0%s \f7%s \f6%s",pcVar6,spreemessages + lVar17 + -0x104,spreemessages + lVar17);
        lVar11 = spreemessages;
        iVar3 = DAT_001942d4;
      }
      lVar15 = lVar15 + 1;
      lVar17 = lVar17 + 0x20c;
    } while (lVar15 < iVar3);
  }
  (target->position).ulen = 0;
  if (smode != (long *)0x0) {
    (**(code **)(*smode + 0x40))(smode,target,actor);
  }
  (target->state).state = 1;
  iVar3 = gamemillis;
  (target->state).lastdeath = gamemillis;
  if (((gamemode + 3U < 0x1a && target != actor) &&
      ((0x55fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0)) &&
     (iVar4 = strcmp(actor->team,target->team), iVar4 == 0)) {
    piVar1 = &(actor->state).teamkills;
    *piVar1 = *piVar1 + 1;
    addteamkill(actor,target,1);
    iVar3 = (target->state).lastdeath;
  }
  (target->state).deadflush = iVar3 + 300;
  return;
}

Assistant:

void dodamage(clientinfo *target, clientinfo *actor, int damage, int gun, const vec &hitpush = vec(0, 0, 0))
    {
        actor->state.guninfo[gun].damage += damage; //damage by gun for #stats
        gamestate &ts = target->state;
        if(enable_passflag && actor!=target && isteam(actor->team, target->team)) {
            ctfmode.dopassflagsequence(actor,target);
            return;
        }
        if(!nodamage) {
            ts.dodamage(damage);
            sendf(-1, 1, "ri6", N_DAMAGE, target->clientnum, actor->clientnum, damage, ts.armour, ts.health);
        }
        if(target!=actor && !isteam(target->team, actor->team)) actor->state.damage += damage;
        if(target==actor) target->setpushed();
        else if(!hitpush.iszero())
        {
            ivec v(vec(hitpush).rescale(DNF));
            sendf(ts.health<=0 ? -1 : target->ownernum, 1, "ri7", N_HITPUSH, target->clientnum, gun, damage, v.x, v.y, v.z);
            target->setpushed();
        }
        if(ts.health<=0)
        {
            //QServ longshot and close up kill (y - depth, z - height, x - left/right)
            float x2 = target->state.o.x;     //target shot x
            float x1 = actor->state.o.x;      //actor shot x
            float y2 = target->state.o.y;     //target shot y
            float y1 = actor->state.o.y;      //actor shot y
            float z2 = target->state.o.z;     //target shot z
            float z1 = actor->state.o.z;      //actor shot z
            
            float d = sqrt(((x2-x1)*(x2-x1))+((y2-y1)*(y2-y1))+((z2-z1)*(z2-z1)));
            int distanceinteger = int(d + 0.5);
            
            //no teamkills, or weird negative float
            if(d > 700.0 && distanceinteger > 0 && actor != target && actor->state.aitype == AI_NONE) {
                out(ECHO_SERV,"\f0%s \f7got a longshot kill on \f6%s \f7(Distance: %d\f7 feet) with a \f1%s", colorname(actor), colorname(target), distanceinteger, guns[gun].name);
            }
            if(d <= 20.0 && actor != target && actor->state.aitype == AI_NONE) {
                out(ECHO_SERV,"\f0%s \f7got an up close kill on \f6%s \f7with a \f1%s", colorname(actor), colorname(target), (!strcmp(guns[gun].name, "fist" )) ? "chainsaw" : guns[gun].name);
            }
            
            target->state.deaths++;
            int fragvalue = smode ? smode->fragvalue(target, actor) : (target==actor || isteam(target->team, actor->team) ? -1 : 1);
            actor->state.frags += fragvalue;
            
            if(fragvalue>0)
            {
                int friends = 0, enemies = 0; // note: friends also includes the fragger
                if(m_teammode) loopv(clients) if(strcmp(clients[i]->team, actor->team)) enemies++; else friends++;
                else { friends = 1; enemies = clients.length()-1; }
                actor->state.effectiveness += fragvalue*friends/float(max(enemies, 1));
                if(totalmillis - actor->state.lastfragmillis < (int64_t)multifragmillis) {
                    actor->state.multifrags++;
                } else {
                    actor->state.multifrags = 1;
                }
                actor->state.lastfragmillis = totalmillis;
            }
            teaminfo *t = m_teammode ? teaminfos.access(actor->team) : NULL;
            if(t) t->frags += fragvalue;
            sendf(-1, 1, "ri5", N_DIED, target->clientnum, actor->clientnum, actor->state.frags, t ? t->frags : 0);
            if(!firstblood && actor != target) { firstblood = true; out(ECHO_SERV, "\f0%s \f7drew \f6FIRST BLOOD!", colorname(actor)); }
            if(actor != target && actor->state.aitype == AI_NONE) actor->state.spreefrags++;
            if(target->state.spreefrags >= minspreefrags && target->state.aitype == AI_NONE) {
                if(actor == target)
                    out(ECHO_SERV, "\f0%s \f7%s", colorname(target), spreesuicidemsg);
                else
                    out(ECHO_SERV, "\f0%s's \f7%s \f6%s", colorname(target), spreefinmsg, colorname(actor));
            }
            target->state.spreefrags = 0;
            target->state.multifrags = 0;
            target->state.lastfragmillis = 0;
            loopv(spreemessages) {
                if(actor->state.spreefrags == spreemessages[i].frags) out(ECHO_SERV, "\f0%s \f7%s \f6%s", colorname(actor), spreemessages[i].msg1, spreemessages[i].msg2);
            }
            target->position.setsize(0);
            if(smode) smode->died(target, actor);
            ts.state = CS_DEAD;
            ts.lastdeath = gamemillis;
            if(actor!=target && isteam(actor->team, target->team))
            {
                actor->state.teamkills++;
                addteamkill(actor, target, 1);
            }
            ts.deadflush = ts.lastdeath + DEATHMILLIS;
            // ts.respawn(); don't issue respawn yet until DEATHMILLIS has elapsed
        }
    }